

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O1

bool __thiscall llvm::Triple::isCompatibleWith(Triple *this,Triple *Other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ArchType AVar5;
  VendorType VVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  AVar5 = this->Arch;
  if (((((AVar5 == thumb) && (Other->Arch == arm)) || ((AVar5 == arm && (Other->Arch == thumb)))) ||
      ((AVar5 == thumbeb && (Other->Arch == armeb)))) ||
     ((AVar5 == armeb && (Other->Arch == thumbeb)))) {
    VVar6 = this->Vendor;
    bVar7 = Other->Vendor != VVar6;
    bVar8 = this->SubArch != Other->SubArch;
    if (VVar6 != Apple) {
      if (((!bVar7 && !bVar8) && (this->OS == Other->OS)) &&
         (this->Environment == Other->Environment)) {
        return this->ObjectFormat == Other->ObjectFormat;
      }
      return false;
    }
    if (bVar7 || bVar8) {
      return false;
    }
  }
  else {
    if (this->Vendor != Apple) {
      auVar9[0] = -((char)Other->Arch == (char)this->Arch);
      auVar9[1] = -(*(byte *)((long)&Other->Arch + 1) == *(byte *)((long)&this->Arch + 1));
      auVar9[2] = -(*(byte *)((long)&Other->Arch + 2) == *(byte *)((long)&this->Arch + 2));
      auVar9[3] = -(*(byte *)((long)&Other->Arch + 3) == *(byte *)((long)&this->Arch + 3));
      auVar9[4] = -((char)Other->SubArch == (char)this->SubArch);
      auVar9[5] = -(*(byte *)((long)&Other->SubArch + 1) == *(byte *)((long)&this->SubArch + 1));
      auVar9[6] = -(*(byte *)((long)&Other->SubArch + 2) == *(byte *)((long)&this->SubArch + 2));
      auVar9[7] = -(*(byte *)((long)&Other->SubArch + 3) == *(byte *)((long)&this->SubArch + 3));
      auVar9[8] = -((char)Other->Vendor == (char)this->Vendor);
      auVar9[9] = -(*(byte *)((long)&Other->Vendor + 1) == *(byte *)((long)&this->Vendor + 1));
      auVar9[10] = -(*(byte *)((long)&Other->Vendor + 2) == *(byte *)((long)&this->Vendor + 2));
      auVar9[0xb] = -(*(byte *)((long)&Other->Vendor + 3) == *(byte *)((long)&this->Vendor + 3));
      auVar9[0xc] = -((char)Other->OS == (char)this->OS);
      auVar9[0xd] = -(*(byte *)((long)&Other->OS + 1) == *(byte *)((long)&this->OS + 1));
      auVar9[0xe] = -(*(byte *)((long)&Other->OS + 2) == *(byte *)((long)&this->OS + 2));
      auVar9[0xf] = -(*(byte *)((long)&Other->OS + 3) == *(byte *)((long)&this->OS + 3));
      uVar1 = this->Environment;
      uVar3 = this->ObjectFormat;
      uVar2 = Other->Environment;
      uVar4 = Other->ObjectFormat;
      auVar10[0] = -((char)uVar2 == (char)uVar1);
      auVar10[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
      auVar10[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
      auVar10[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
      auVar10[4] = -((char)uVar4 == (char)uVar3);
      auVar10[5] = -((char)((uint)uVar4 >> 8) == (char)((uint)uVar3 >> 8));
      auVar10[6] = -((char)((uint)uVar4 >> 0x10) == (char)((uint)uVar3 >> 0x10));
      auVar10[7] = -((char)((uint)uVar4 >> 0x18) == (char)((uint)uVar3 >> 0x18));
      auVar10[8] = 0xff;
      auVar10[9] = 0xff;
      auVar10[10] = 0xff;
      auVar10[0xb] = 0xff;
      auVar10[0xc] = 0xff;
      auVar10[0xd] = 0xff;
      auVar10[0xe] = 0xff;
      auVar10[0xf] = 0xff;
      auVar10 = auVar10 & auVar9;
      return (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff;
    }
    if (AVar5 != Other->Arch) {
      return false;
    }
    if (this->SubArch != Other->SubArch) {
      return false;
    }
    if (Other->Vendor != Apple) {
      return false;
    }
  }
  return this->OS == Other->OS;
}

Assistant:

SubArchType getSubArch() const { return SubArch; }